

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O0

void __thiscall TPZGaussRule::SetType(TPZGaussRule *this,int *type,int order)

{
  int iVar1;
  int *in_RSI;
  TPZVec<long_double> *in_RDI;
  TPZGaussRule *unaff_retaddr;
  int neworder;
  int in_stack_00000194;
  TPZGaussRule *in_stack_00000198;
  size_t in_stack_000003c8;
  char *in_stack_000003d0;
  int in_stack_ffffffffffffffac;
  undefined2 in_stack_ffffffffffffffb0;
  undefined6 in_stack_ffffffffffffffb2;
  undefined8 uVar2;
  undefined2 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffda;
  undefined4 in_stack_ffffffffffffffdc;
  undefined2 in_stack_ffffffffffffffe8;
  short sStack_16;
  TPZVec<long_double> *pTVar3;
  int order_00;
  
  if ((*in_RSI < 0) || (3 < *in_RSI)) {
    *in_RSI = 0;
  }
  uVar2 = 0;
  pTVar3 = in_RDI;
  TPZVec<long_double>::Resize
            (in_RDI,CONCAT44(in_stack_ffffffffffffffdc,
                             CONCAT22(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8)));
  order_00 = (int)((ulong)pTVar3 >> 0x20);
  TPZVec<long_double>::Resize
            (in_RDI,CONCAT44(in_stack_ffffffffffffffdc,
                             CONCAT22(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8)));
  *(int *)&in_RDI->_vptr_TPZVec = *in_RSI;
  iVar1 = *in_RSI;
  if (iVar1 == 1) {
    iVar1 = ComputingGaussLobattoQuadrature(in_stack_00000198,in_stack_00000194);
    sStack_16 = (short)((uint)iVar1 >> 0x10);
  }
  else if (iVar1 == 2) {
    iVar1 = ComputingGaussJacobiQuadrature
                      (unaff_retaddr,order_00,(longdouble)CONCAT28(in_stack_ffffffffffffffe8,in_RDI)
                       ,(longdouble)CONCAT28(in_stack_ffffffffffffffd8,uVar2));
    sStack_16 = (short)((uint)iVar1 >> 0x10);
  }
  else if (iVar1 == 3) {
    iVar1 = ComputingGaussChebyshevQuadrature(this,type._4_4_);
    sStack_16 = (short)((uint)iVar1 >> 0x10);
  }
  else {
    iVar1 = ComputingGaussLegendreQuadrature
                      ((TPZGaussRule *)CONCAT62(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0)
                       ,in_stack_ffffffffffffffac);
    sStack_16 = (short)((uint)iVar1 >> 0x10);
  }
  if (sStack_16 < 0) {
    pzinternal::DebugStopImpl(in_stack_000003d0,in_stack_000003c8);
  }
  return;
}

Assistant:

void TPZGaussRule::SetType(int &type,int order) {
	if(order < 0) order = 1;
	if(type < 0 || type > 3) type = 0;
		fLocation.Resize(0);
		fWeight.Resize(0);
		fType = type;
    int neworder;
		switch(type) {
			case 1:   // Lobatto
			{
				// Computing the points and weights for the symmetric Gaussian quadrature (using Legendre polynomials) 
				neworder=ComputingGaussLobattoQuadrature(order);
			}
				break;
			case 2:   // Jacobi
			{
				// Computing the points and weights for the symmetric Gaussian quadrature (using Legendre polynomials) 
				neworder=ComputingGaussJacobiQuadrature(order,fAlpha,fBeta);
			}
				break;
			case 3:  // Chebyshev
			{
				neworder=ComputingGaussChebyshevQuadrature(order);
			}
				break;
			default:     // Legendre (default)
			{
				// Computing the points and weights for the symmetric Gaussian quadrature (using Legendre polynomials) 
				neworder=ComputingGaussLegendreQuadrature(order);
			}
				break;
		}
    if(neworder < 0)
        DebugStop();
}